

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

ssize_t __thiscall FileWriter::write(FileWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  ofstream of;
  string path;
  FileWriter *this_00;
  char local_250 [16];
  string *in_stack_fffffffffffffdc0;
  FileWriter *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffe50;
  FileWriter *in_stack_fffffffffffffe58;
  FileWriter local_40;
  vector<char,_std::allocator<char>_> *local_18;
  undefined8 local_10;
  FileWriter *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  this_00 = &local_40;
  local_40._32_8_ = __n;
  local_18 = (vector<char,_std::allocator<char>_> *)__buf;
  local_8 = this;
  buildPath(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  bVar1 = tryWrite(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Writing: ");
    std::operator<<(poVar2,(string *)&local_40);
    std::ofstream::ofstream(local_250,(string *)&local_40,_S_out);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x26200c);
    std::vector<char,_std::allocator<char>_>::size(local_18);
    std::ostream::write(local_250,(long)pcVar3);
    logTime(this_00,(Timer *)this);
    std::ofstream::~ofstream(local_250);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Skipping (file exists): ");
    std::operator<<(poVar2,(string *)&local_40);
    logTime(this_00,(Timer *)this);
  }
  sVar4 = std::__cxx11::string::~string((string *)&local_40);
  return sVar4;
}

Assistant:

void FileWriter::write(
  const std::string& tail,
  const std::vector<char>& data,
  const Timer* t) {
  auto path = buildPath(tail);
  if (!tryWrite(path)) {
    std::cout << "Skipping (file exists): " << path;
    logTime(t);
    return;
  }

  std::cout << "Writing: " << path;
  std::ofstream of(path);
  of.write(data.data(), data.size());
  logTime(t);
}